

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

bool __thiscall Clasp::Cli::ConfigIter::next(ConfigIter *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ConfigIter *in_RDI;
  
  pcVar2 = args(in_RDI);
  in_RDI->base_ = pcVar2;
  sVar3 = strlen(in_RDI->base_);
  in_RDI->base_ = in_RDI->base_ + sVar3 + 1;
  bVar1 = valid(in_RDI);
  return bVar1;
}

Assistant:

bool        ConfigIter::next()       {
	base_ = args();
	base_+= std::strlen(base_) + 1;
	return valid();
}